

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O2

void __thiscall YAML::Scanner::ScanTag(Scanner *this)

{
  bool bVar1;
  char cVar2;
  bool *canBeHandle_00;
  Stream *INPUT;
  Stream *INPUT_00;
  bool canBeHandle;
  string tag;
  char local_89;
  string local_88;
  undefined1 local_68 [24];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined1 local_30 [20];
  undefined8 uStack_1c;
  
  InsertPotentialSimpleKey(this);
  this->m_simpleKeyAllowed = false;
  this->m_canBeJSONFlow = false;
  local_68._8_4_ = (this->INPUT).m_mark.pos;
  local_68._12_4_ = (this->INPUT).m_mark.line;
  local_68._16_4_ = (this->INPUT).m_mark.column;
  canBeHandle_00 = (bool *)(ulong)(uint)local_68._16_4_;
  local_50._M_p = (pointer)&local_40;
  local_68._0_4_ = VALID;
  local_68._4_4_ = TAG;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_30._0_8_ = (pointer)0x0;
  local_30._8_4_ = 0;
  local_30._12_4_ = 0;
  local_30._16_4_ = 0;
  uStack_1c = 0;
  YAML::Stream::get(&this->INPUT);
  bVar1 = YAML::Stream::operator_cast_to_bool(&this->INPUT);
  if (bVar1) {
    cVar2 = YAML::Stream::peek(&this->INPUT);
    if (cVar2 == '<') {
      ScanVerbatimTag_abi_cxx11_(&local_88,(YAML *)this,INPUT);
      std::__cxx11::string::_M_assign((string *)&local_50);
      uStack_1c = uStack_1c & 0xffffffff;
      std::__cxx11::string::~string((string *)&local_88);
      goto LAB_006a937a;
    }
  }
  ScanTagHandle_abi_cxx11_(&local_88,(YAML *)this,(Stream *)&local_89,canBeHandle_00);
  std::__cxx11::string::_M_assign((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_88);
  if (local_48 == 0 && local_89 == '\0') {
    uStack_1c = CONCAT44(4,(undefined4)uStack_1c);
  }
  else {
    uStack_1c = CONCAT44((local_48 == 0) + 1,(undefined4)uStack_1c);
    if (local_89 != '\0') {
      cVar2 = YAML::Stream::peek(&this->INPUT);
      if (cVar2 == '!') {
        YAML::Stream::get(&this->INPUT);
        ScanTagSuffix_abi_cxx11_(&local_88,(YAML *)this,INPUT_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_30,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        uStack_1c = CONCAT44(3,(undefined4)uStack_1c);
      }
    }
  }
LAB_006a937a:
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::push_back
            (&(this->m_tokens).c,(value_type *)local_68);
  Token::~Token((Token *)local_68);
  return;
}

Assistant:

void Scanner::ScanTag() {
  // insert a potential simple key
  InsertPotentialSimpleKey();
  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = false;

  Token token(Token::TAG, INPUT.mark());

  // eat the indicator
  INPUT.get();

  if (INPUT && INPUT.peek() == Keys::VerbatimTagStart) {
    std::string tag = ScanVerbatimTag(INPUT);

    token.value = tag;
    token.data = Tag::VERBATIM;
  } else {
    bool canBeHandle;
    token.value = ScanTagHandle(INPUT, canBeHandle);
    if (!canBeHandle && token.value.empty())
      token.data = Tag::NON_SPECIFIC;
    else if (token.value.empty())
      token.data = Tag::SECONDARY_HANDLE;
    else
      token.data = Tag::PRIMARY_HANDLE;

    // is there a suffix?
    if (canBeHandle && INPUT.peek() == Keys::Tag) {
      // eat the indicator
      INPUT.get();
      token.params.push_back(ScanTagSuffix(INPUT));
      token.data = Tag::NAMED_HANDLE;
    }
  }

  m_tokens.push(token);
}